

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

dataid MetaFindParam(node *p,tchar_t *Token)

{
  byte bVar1;
  ulong in_RAX;
  bool_t bVar2;
  long lVar3;
  uint *puVar4;
  bool bVar5;
  
  if (Token != (tchar_t *)0x0) {
    lVar3 = (long)p->VMT + -0x48;
    bVar5 = false;
    do {
      puVar4 = *(uint **)(lVar3 + 8);
      if (puVar4 != (uint *)0x0) {
        do {
          bVar1 = (byte)*puVar4;
          in_RAX = (ulong)bVar1;
          if (bVar1 == 0x1e) {
            bVar2 = tcsisame_ascii(Token,*(tchar_t **)(puVar4 + 2));
            if (bVar2 != 0) {
              in_RAX = (ulong)(*puVar4 >> 8);
              goto LAB_0010eb20;
            }
          }
          else if (bVar1 == 0) break;
          puVar4 = puVar4 + 4;
        } while( true );
      }
      lVar3 = *(long *)(lVar3 + 0x18);
      bVar5 = lVar3 == 0;
    } while (!bVar5);
LAB_0010eb20:
    if (!bVar5) {
      return in_RAX;
    }
  }
  return 0;
}

Assistant:

static dataid MetaFindParam(node* p,const tchar_t* Token)
{
    if (Token)
    {
        const nodeclass* c;
        const nodemeta* m;

        for (c = NodeGetClass(p);c;c=c->ParentClass)
            if (c->Meta) // should be registered, just fail safe
                for (m=c->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                    if (m->Meta == META_PARAM_NAME && tcsisame_ascii(Token,(const tchar_t*)m->Data))
                    {
                        return m->Id;
                    }
    }
    return 0;
}